

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# large.c
# Opt level: O0

void duckdb_je_large_prof_info_set(edata_t *edata,prof_tctx_t *tctx,size_t size)

{
  size_t in_RDX;
  edata_t *in_RDI;
  nstime_t t;
  prof_tctx_t *in_stack_ffffffffffffffd8;
  edata_t *in_stack_ffffffffffffffe0;
  
  duckdb_je_nstime_prof_init_update((nstime_t *)in_stack_ffffffffffffffd8);
  edata_prof_alloc_time_set(in_stack_ffffffffffffffe0,(nstime_t *)in_stack_ffffffffffffffd8);
  edata_prof_alloc_size_set(in_RDI,in_RDX);
  duckdb_je_edata_prof_recent_alloc_init(in_RDI);
  large_prof_tctx_set(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void
large_prof_info_set(edata_t *edata, prof_tctx_t *tctx, size_t size) {
	nstime_t t;
	nstime_prof_init_update(&t);
	edata_prof_alloc_time_set(edata, &t);
	edata_prof_alloc_size_set(edata, size);
	edata_prof_recent_alloc_init(edata);
	large_prof_tctx_set(edata, tctx);
}